

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  Curl_hash_element **ppCVar1;
  size_t sVar2;
  Curl_hash_element *pCVar3;
  Curl_hash_element *pCVar4;
  
  ppCVar1 = h->table;
  if (ppCVar1 == (Curl_hash_element **)0x0) {
    ppCVar1 = (Curl_hash_element **)(*Curl_ccalloc)(h->slots,8);
    h->table = ppCVar1;
    if (ppCVar1 == (Curl_hash_element **)0x0) {
      return (void *)0x0;
    }
  }
  sVar2 = (*h->hash_func)(key,key_len,h->slots);
  pCVar4 = (Curl_hash_element *)(ppCVar1 + sVar2);
  pCVar3 = pCVar4;
  while (pCVar3 = pCVar3->next, pCVar3 != (Curl_hash_element *)0x0) {
    sVar2 = (*h->comp_func)(pCVar3->key,pCVar3->key_len,key,key_len);
    if (sVar2 != 0) {
      hash_elem_clear_ptr(h,pCVar3);
      pCVar3->ptr = p;
      pCVar3->dtor = dtor;
      return p;
    }
  }
  pCVar3 = (Curl_hash_element *)(*Curl_cmalloc)(key_len + 0x28);
  if (pCVar3 == (Curl_hash_element *)0x0) {
    return (void *)0x0;
  }
  pCVar3->next = (Curl_hash_element *)0x0;
  memcpy(pCVar3->key,key,key_len);
  pCVar3->key_len = key_len;
  pCVar3->ptr = p;
  pCVar3->dtor = dtor;
  pCVar3->next = pCVar4->next;
  pCVar4->next = pCVar3;
  h->size = h->size + 1;
  return p;
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element *he, **slot;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    h->table = calloc(h->slots, sizeof(struct Curl_hash_element *));
    if(!h->table)
      return NULL; /* OOM */
  }

  slot = CURL_HASH_SLOT_ADDR(h, key, key_len);
  for(he = *slot; he; he = he->next) {
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      /* existing key entry, overwrite by clearing old pointer */
      hash_elem_clear_ptr(h, he);
      he->ptr = (void *)p;
      he->dtor = dtor;
      return p;
    }
  }

  he = hash_elem_create(key, key_len, p, dtor);
  if(!he)
    return NULL; /* OOM */

  hash_elem_link(h, slot, he);
  return p; /* return the new entry */
}